

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O0

ssize_t __thiscall rw::TGAHeader::read(TGAHeader *this,int __fd,void *__buf,size_t __nbytes)

{
  Stream *this_00;
  int8 iVar1;
  uint8 uVar2;
  int16 iVar3;
  undefined4 in_register_00000034;
  Stream *stream_local;
  TGAHeader *this_local;
  
  this_00 = (Stream *)CONCAT44(in_register_00000034,__fd);
  iVar1 = Stream::readI8(this_00);
  this->IDlen = iVar1;
  iVar1 = Stream::readI8(this_00);
  this->colorMapType = iVar1;
  iVar1 = Stream::readI8(this_00);
  this->imageType = iVar1;
  iVar3 = Stream::readI16(this_00);
  this->colorMapOrigin = iVar3;
  iVar3 = Stream::readI16(this_00);
  this->colorMapLength = iVar3;
  iVar1 = Stream::readI8(this_00);
  this->colorMapDepth = iVar1;
  iVar3 = Stream::readI16(this_00);
  this->xOrigin = iVar3;
  iVar3 = Stream::readI16(this_00);
  this->yOrigin = iVar3;
  iVar3 = Stream::readI16(this_00);
  this->width = iVar3;
  iVar3 = Stream::readI16(this_00);
  this->height = iVar3;
  uVar2 = Stream::readU8(this_00);
  this->depth = uVar2;
  uVar2 = Stream::readU8(this_00);
  this->descriptor = uVar2;
  return (ssize_t)this;
}

Assistant:

void
TGAHeader::read(Stream *stream)
{
	IDlen = stream->readI8();
	colorMapType = stream->readI8();
	imageType = stream->readI8();
	colorMapOrigin = stream->readI16();
	colorMapLength = stream->readI16();
	colorMapDepth = stream->readI8();
	xOrigin = stream->readI16();
	yOrigin = stream->readI16();
	width = stream->readI16();
	height = stream->readI16();
	depth = stream->readU8();
	descriptor = stream->readU8();
}